

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

void __thiscall
dja::mat4::mat4(mat4 *this,float_t m00,float_t m01,float_t m02,float_t m03,float_t m10,float_t m11,
               float_t m12,float_t m13,float_t m20,float_t m21,float_t m22,float_t m23,float_t m30,
               float_t m31,float_t m32,float_t m33)

{
  this->m[0].x = m00;
  this->m[0].y = m01;
  this->m[0].z = m02;
  this->m[0].w = m03;
  this->m[1].x = m10;
  this->m[1].y = m11;
  this->m[1].z = m12;
  this->m[1].w = m13;
  this->m[2].x = m20;
  this->m[2].y = m21;
  this->m[2].z = m22;
  this->m[2].w = m23;
  this->m[3].x = m30;
  this->m[3].y = m31;
  this->m[3].z = m32;
  this->m[3].w = m33;
  return;
}

Assistant:

mat4::mat4(
    float_t m00, float_t m01, float_t m02, float_t m03,
    float_t m10, float_t m11, float_t m12, float_t m13,
    float_t m20, float_t m21, float_t m22, float_t m23,
    float_t m30, float_t m31, float_t m32, float_t m33
) {
    m[0] = vec4(m00, m01, m02, m03);
    m[1] = vec4(m10, m11, m12, m13);
    m[2] = vec4(m20, m21, m22, m23);
    m[3] = vec4(m30, m31, m32, m33);
}